

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_tests.cpp
# Opt level: O0

void move_value_test(void)

{
  int iVar1;
  char *__s;
  int status_code;
  state<0U,_(libbrain::bfop)6,_(libbrain::bfop)6,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)8,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)0,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)9>
  move_program;
  uchar *data;
  uint in_stack_ffffffffffffffdc;
  uchar *in_stack_ffffffffffffffe0;
  
  printf("\n");
  printf("move_value_test");
  printf("\n");
  __s = (char *)operator_new__(10000);
  memset(__s,0,10000);
  *__s = 'd';
  __s[2] = 'L';
  iVar1 = libbrain::
          state<0U,_(libbrain::bfop)6,_(libbrain::bfop)6,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)8,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)0,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)9>
          ::exec(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  if (iVar1 == 0) {
    printf("=> Passed: status_code == 0\n");
  }
  else {
    printf("=> Failed: status_code == 0\n");
  }
  if (*__s == '\0') {
    printf("=> Passed: data[0] == 0\n");
  }
  else {
    printf("=> Failed: data[0] == 0\n");
  }
  if (__s[1] == '\0') {
    printf("=> Passed: data[1] == 0\n");
  }
  else {
    printf("=> Failed: data[1] == 0\n");
  }
  if (__s[2] == 'd') {
    printf("=> Passed: data[2] == 100\n");
  }
  else {
    printf("=> Failed: data[2] == 100\n");
  }
  __s[1] = -0x37;
  iVar1 = libbrain::
          state<0U,_(libbrain::bfop)6,_(libbrain::bfop)6,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)8,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)0,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)9>
          ::exec(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  if (iVar1 == 0) {
    printf("=> Passed: status_code == 0\n");
  }
  else {
    printf("=> Failed: status_code == 0\n");
  }
  if (*__s == '\0') {
    printf("=> Passed: data[0] == 0\n");
  }
  else {
    printf("=> Failed: data[0] == 0\n");
  }
  if (__s[1] == '\0') {
    printf("=> Passed: data[1] == 0\n");
  }
  else {
    printf("=> Failed: data[1] == 0\n");
  }
  if (__s[2] == 'd') {
    printf("=> Passed: data[2] == 100\n");
  }
  else {
    printf("=> Failed: data[2] == 100\n");
  }
  if (__s[3] == -0x37) {
    printf("=> Passed: data[3] == 201\n");
  }
  else {
    printf("=> Failed: data[3] == 201\n");
  }
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void move_value_test() {
    LIBBRAIN_TEST

    auto* data = BRAIN_ALLOC_TAPE(10000);
    data[0] = 100;
    data[2] = 76;

    // BF Program which moves the value in one index to one 2 indicies over, overwriting the thing 2 cells over
    BRAIN_PROGRAM move_program = BRAIN_COMPILE(>>[-]<<[->>+<<]);
    int status_code = move_program.exec(data, 0);

    LIBBRAIN_ASSERT(status_code, 0)
    LIBBRAIN_ASSERT(data[0], 0)
    LIBBRAIN_ASSERT(data[1], 0)
    LIBBRAIN_ASSERT(data[2], 100)

    data[1] = 201;

    status_code = move_program.exec(data, 1);
    LIBBRAIN_ASSERT(status_code, 0)
    LIBBRAIN_ASSERT(data[0], 0)
    LIBBRAIN_ASSERT(data[1], 0)
    LIBBRAIN_ASSERT(data[2], 100)
    LIBBRAIN_ASSERT(data[3], 201)

    delete[] data;
}